

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O2

Node * makeVariable(char *name)

{
  Node *pNVar1;
  int iVar2;
  Node *pNVar3;
  char *pcVar4;
  Node **ppNVar5;
  
  if (thisRule == (Node *)0x0) {
    __assert_fail("thisRule",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tokuhirom[P]pvip/3rd/greg/tree.c"
                  ,0x66,"Node *makeVariable(char *)");
  }
  ppNVar5 = &(thisRule->rule).variables;
  while( true ) {
    pNVar1 = *ppNVar5;
    if (pNVar1 == (Node *)0x0) {
      pNVar3 = _newNode(2,0x30);
      pcVar4 = strdup(name);
      (pNVar3->rule).name = pcVar4;
      pNVar1 = thisRule;
      (pNVar3->rule).next = (thisRule->rule).variables;
      (pNVar1->rule).variables = pNVar3;
      return pNVar3;
    }
    iVar2 = strcmp(name,(pNVar1->rule).name);
    if (iVar2 == 0) break;
    ppNVar5 = &(pNVar1->rule).next;
  }
  return pNVar1;
}

Assistant:

Node *makeVariable(char *name)
{
  Node *node;
  assert(thisRule);
  for (node= thisRule->rule.variables;  node;  node= node->variable.next)
    if (!strcmp(name, node->variable.name))
      return node;
  node= newNode(Variable);
  node->variable.name= strdup(name);
  node->variable.next= thisRule->rule.variables;
  thisRule->rule.variables= node;
  return node;
}